

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadAffineSpace3faArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 uVar1;
  element_type *peVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  size_type sVar8;
  runtime_error *this_00;
  size_t *in_RDX;
  XML *in_RDI;
  size_t i_11;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  temp;
  AffineSpace3ff space;
  Ref<embree::XML> child;
  size_t i;
  avector<AffineSpace3ff> *spaceArray;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_12;
  size_t i_13;
  size_t i_6;
  size_t i_5;
  size_t i_10;
  size_t i_9;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_1;
  size_t i_8;
  size_t i_7;
  size_t i_4;
  size_t i_3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced_1;
  size_t new_size_alloced;
  char *in_stack_fffffffffffff558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff560;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff568;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  *in_stack_fffffffffffff570;
  string *in_stack_fffffffffffff5a0;
  XML *this_01;
  XML *in_stack_fffffffffffff5a8;
  ParseLocation *in_stack_fffffffffffff608;
  size_t sVar9;
  XML *pXVar10;
  string local_978 [32];
  undefined8 local_958;
  ulong uStack_950;
  undefined8 local_948;
  ulong uStack_940;
  undefined8 local_938;
  ulong uStack_930;
  undefined8 local_928;
  ulong uStack_920;
  undefined8 local_918;
  ulong uStack_910;
  undefined8 local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  ulong uStack_8f0;
  undefined8 local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  undefined1 local_8c9;
  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
  local_8c8;
  allocator local_8a9;
  string local_8a8 [32];
  string local_888 [32];
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  Ref<embree::XML> *in_stack_fffffffffffff7d8;
  XMLLoader *in_stack_fffffffffffff7e0;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  long *local_7e0 [3];
  ulong local_7c8;
  undefined1 local_7b9;
  size_t *local_7b8;
  size_t *local_7a0;
  size_t *local_798;
  size_t *local_790;
  size_t *local_788;
  undefined8 *local_778;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_770;
  undefined8 *local_760;
  Vector *local_758;
  undefined8 *local_738;
  undefined1 *local_730;
  undefined8 *local_728;
  undefined1 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined1 *local_6b8;
  long **local_6a8;
  element_type *local_678;
  reference local_668;
  undefined8 *local_660;
  Vector *local_658;
  undefined8 *local_650;
  size_type local_648;
  undefined8 local_638;
  ulong uStack_630;
  float local_628;
  float local_624;
  float local_620;
  undefined4 local_61c;
  undefined8 *local_618;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_610;
  undefined8 *local_608;
  Vector *local_600;
  undefined1 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_5d0;
  Vector *local_5c8;
  Vector *local_5c0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  Vector *local_590;
  undefined1 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined1 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_540;
  undefined8 *local_538;
  Vector *local_530;
  undefined8 *local_528;
  Vector *local_520;
  undefined8 *local_518;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_510;
  undefined8 *local_508;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_500;
  undefined8 *local_4f8;
  Vector *local_4f0;
  undefined8 *local_4e8;
  Vector *local_4e0;
  undefined8 *local_4d8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined1 *local_450;
  element_type *local_3a8;
  ulong local_3a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_398;
  element_type *local_390;
  element_type *local_388;
  element_type *local_380;
  element_type *local_378;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_368;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_360;
  element_type *local_358;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_348;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_340;
  Vector *local_338;
  Vector *local_330;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_328;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_320;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_318;
  Vector *local_310;
  Vector *local_308;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_300;
  Vector *local_2f8;
  Vector *local_2f0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_2e8;
  Vector *local_2e0;
  Vector *local_2d8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_2d0;
  Vector *local_2c8;
  Vector *local_2c0;
  Vector *local_2b8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_2b0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_2a8;
  Vector *local_2a0;
  Vector *local_298;
  Vector *local_290;
  Vector *local_288;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_280;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_278;
  element_type *local_270;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_268;
  ulong local_258;
  ulong local_250;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_248;
  ulong local_240;
  ulong local_238;
  element_type *local_230;
  ulong local_228;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_218;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_210;
  element_type *local_208;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1f8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1f0;
  Vector *local_1e8;
  Vector *local_1e0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1d8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1d0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1c8;
  Vector *local_1c0;
  Vector *local_1b8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1b0;
  Vector *local_1a8;
  Vector *local_1a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_198;
  Vector *local_190;
  Vector *local_188;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_180;
  Vector *local_178;
  Vector *local_170;
  Vector *local_168;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_160;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_158;
  Vector *local_150;
  Vector *local_148;
  Vector *local_140;
  Vector *local_138;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_130;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_128;
  element_type *local_120;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_118;
  unsigned_long local_108 [2];
  element_type *local_f8;
  element_type *local_f0;
  Ref<embree::XML> *in_stack_ffffffffffffff20;
  XMLLoader *in_stack_ffffffffffffff28;
  unsigned_long local_d0;
  element_type *local_c8;
  element_type *local_c0;
  element_type *local_b0;
  reference local_a8;
  undefined8 *local_a0;
  reference local_98;
  undefined8 *local_90;
  Vector *local_88;
  undefined8 *local_80;
  Vector *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  ulong uStack_60;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  undefined8 local_48;
  ulong uStack_40;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  ulong uStack_20;
  float local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  if (*in_RDX == 0) {
    (in_RDI->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (in_RDI->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (in_RDI->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = in_RDI;
    local_7b8 = in_RDX;
    bVar4 = std::operator==(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    if (bVar4) {
      local_7b9 = 0;
      (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (this_01->loc).fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this_01->loc).fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_7c8 = 0;
      while( true ) {
        uVar3 = local_7c8;
        local_788 = local_7b8;
        sVar9 = *local_7b8;
        sVar5 = XML::size((XML *)0x38364d);
        if (sVar5 <= uVar3) break;
        local_790 = local_7b8;
        XML::child(this_01,sVar9);
        load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        local_730 = &stack0xfffffffffffff7d8;
        local_738 = &local_868;
        local_460 = &local_818;
        local_468 = &local_858;
        local_470 = &local_808;
        local_478 = &local_848;
        local_480 = &local_7f8;
        local_488 = &local_838;
        local_6b8 = &stack0xfffffffffffff7d8;
        local_5f0 = &local_6f8;
        local_5a8 = &local_6e8;
        local_5b0 = &local_6d8;
        local_598 = &local_6c8;
        local_6f8 = local_868;
        uStack_6f0 = uStack_860;
        local_568 = &local_818;
        local_560 = &local_6e8;
        local_6e8 = local_818;
        uStack_6e0 = uStack_810;
        local_578 = &local_808;
        local_570 = &local_6d8;
        local_6d8 = local_808;
        uStack_6d0 = uStack_800;
        local_5e8 = &local_7f8;
        local_5e0 = &local_6c8;
        local_6c8 = local_7f8;
        uStack_6c0 = uStack_7f0;
        sVar9 = (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i;
        local_c0 = (element_type *)
                   ((this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i + 1
                   );
        pXVar10 = this_01;
        local_728 = local_738;
        local_720 = local_730;
        local_5f8 = local_6b8;
        local_5d8 = local_5f0;
        local_5a0 = local_5f0;
        local_588 = local_6b8;
        local_580 = local_5f0;
        local_558 = local_6b8;
        local_550 = local_5f0;
        local_458 = local_738;
        local_450 = local_730;
        local_818 = local_858;
        uStack_810 = uStack_850;
        local_808 = local_848;
        uStack_800 = uStack_840;
        local_7f8 = local_838;
        uStack_7f0 = uStack_830;
        if ((this_01->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr < local_c0) {
          peVar2 = local_c0;
          if ((this_01->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) {
            local_c8 = (this_01->loc).fileName.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
            while (local_c8 < local_c0) {
              local_d0 = 1;
              in_stack_ffffffffffffff28 = (XMLLoader *)((long)local_c8 << 1);
              puVar6 = std::max<unsigned_long>(&local_d0,(unsigned_long *)&stack0xffffffffffffff28);
              local_c8 = (element_type *)*puVar6;
            }
            local_b0 = local_c8;
            peVar2 = local_b0;
          }
        }
        else {
          peVar2 = (this_01->loc).fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        }
        local_b0 = peVar2;
        local_230 = local_b0;
        uVar3 = sVar9;
        if (sVar9 < (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i) {
          while (local_238 = uVar3,
                local_238 <
                (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i) {
            uVar3 = local_238 + 1;
          }
          (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = sVar9;
        }
        local_228 = sVar9;
        if (local_b0 ==
            (this_01->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr) {
          for (local_240 = (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>.
                           _M_i; local_240 < sVar9; local_240 = local_240 + 1) {
            local_218 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (this_01->loc).fileName.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + local_240;
            local_1b8 = &(local_218->l).vy;
            local_1c0 = &(local_218->l).vz;
            local_168 = &local_218->p;
            local_1c8 = local_218;
            local_1b0 = local_218;
          }
          (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = sVar9;
        }
        else {
          local_248 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      (this_01->loc).fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
          local_208 = local_b0;
          pAVar7 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc((size_t)in_stack_fffffffffffff568,(size_t)in_stack_fffffffffffff560
                                );
          (this_01->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar7;
          for (local_250 = 0;
              local_250 <
              (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i;
              local_250 = local_250 + 1) {
            local_1f0 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (this_01->loc).fileName.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + local_250;
            local_1f8 = local_248 + local_250;
            local_188 = &(local_1f0->l).vy;
            local_190 = &(local_1f0->l).vz;
            local_178 = &local_1f0->p;
            uVar1 = *(undefined8 *)((long)&(local_1f8->l).vx.field_0 + 8);
            *(undefined8 *)&(local_1f0->l).vx.field_0 = *(undefined8 *)&(local_1f8->l).vx.field_0;
            *(undefined8 *)((long)&(local_1f0->l).vx.field_0 + 8) = uVar1;
            local_140 = &(local_1f8->l).vy;
            local_138 = &(local_1f0->l).vy;
            uVar1 = *(undefined8 *)((long)&(local_1f8->l).vy.field_0 + 8);
            *(undefined8 *)&local_138->field_0 = *(undefined8 *)&local_140->field_0;
            *(undefined8 *)((long)&(local_1f0->l).vy.field_0 + 8) = uVar1;
            local_150 = &(local_1f8->l).vz;
            local_148 = &(local_1f0->l).vz;
            uVar1 = *(undefined8 *)((long)&(local_1f8->l).vz.field_0 + 8);
            *(undefined8 *)&local_148->field_0 = *(undefined8 *)&local_150->field_0;
            *(undefined8 *)((long)&(local_1f0->l).vz.field_0 + 8) = uVar1;
            local_1e8 = &local_1f8->p;
            local_1e0 = &local_1f0->p;
            uVar1 = *(undefined8 *)((long)&(local_1f8->p).field_0 + 8);
            *(undefined8 *)&local_1e0->field_0 = *(undefined8 *)&local_1e8->field_0;
            *(undefined8 *)((long)&(local_1f0->p).field_0 + 8) = uVar1;
            local_1d8 = local_1f0;
            local_180 = local_1f0;
            local_160 = local_1f8;
            local_158 = local_1f0;
            local_130 = local_1f8;
            local_128 = local_1f0;
          }
          for (local_258 = (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>.
                           _M_i; local_258 < local_228; local_258 = local_258 + 1) {
            local_210 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (this_01->loc).fileName.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + local_258;
            local_1a0 = &(local_210->l).vy;
            local_1a8 = &(local_210->l).vz;
            local_170 = &local_210->p;
            local_1d0 = local_210;
            local_198 = local_210;
          }
          local_120 = (this_01->loc).fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          local_118 = local_248;
          alignedFree(in_stack_fffffffffffff558);
          (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = local_228;
          (this_01->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_230;
        }
        local_610 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (this_01->loc).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        sVar9 = (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i;
        (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = sVar9 + 1;
        local_610 = local_610 + sVar9;
        local_618 = &local_6f8;
        local_5c0 = &(local_610->l).vy;
        local_5c8 = &(local_610->l).vz;
        local_590 = &local_610->p;
        *(undefined8 *)&(local_610->l).vx.field_0 = local_6f8;
        *(undefined8 *)((long)&(local_610->l).vx.field_0 + 8) = uStack_6f0;
        local_528 = &local_6e8;
        local_520 = &(local_610->l).vy;
        *(undefined8 *)&local_520->field_0 = local_6e8;
        *(undefined8 *)((long)&(local_610->l).vy.field_0 + 8) = uStack_6e0;
        local_538 = &local_6d8;
        local_530 = &(local_610->l).vz;
        *(undefined8 *)&local_530->field_0 = local_6d8;
        *(undefined8 *)((long)&(local_610->l).vz.field_0 + 8) = uStack_6d0;
        local_608 = &local_6c8;
        local_600 = &local_610->p;
        (local_600->field_0).m128[0] = (float)local_6c8;
        (local_610->p).field_0.m128[1] = local_6c8._4_4_;
        (local_610->p).field_0.m128[2] = (float)uStack_6c0;
        (local_610->p).field_0.m128[3] = uStack_6c0._4_4_;
        local_6a8 = local_7e0;
        local_5d0 = local_610;
        local_5b8 = local_610;
        local_548 = local_618;
        local_540 = local_610;
        local_518 = local_618;
        local_510 = local_610;
        if (local_7e0[0] != (long *)0x0) {
          (**(code **)(*local_7e0[0] + 0x18))();
        }
        local_7c8 = local_7c8 + 1;
        this_01 = pXVar10;
      }
    }
    else {
      local_798 = local_7b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8a8,"ofs",&local_8a9);
      XML::parm(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
      bVar4 = std::operator!=(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
      std::__cxx11::string::~string(local_888);
      std::__cxx11::string::~string(local_8a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
      if (!bVar4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_7a0 = local_7b8;
        __rhs = (char *)*local_7b8;
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffff608);
        std::operator+(in_stack_fffffffffffff568,__rhs);
        std::runtime_error::runtime_error(this_00,local_978);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadBinary<std::vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>,std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>>>>
                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
      local_8c9 = 0;
      (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (this_01->loc).fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this_01->loc).fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_378 = (element_type *)
                  std::
                  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  ::size(&local_8c8);
      pXVar10 = this_01;
      local_678 = local_378;
      local_f0 = local_378;
      if ((this_01->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr < local_378) {
        local_380 = local_378;
        if ((this_01->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          local_f8 = (this_01->loc).fileName.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
          while (local_380 = local_f8, local_f8 < local_f0) {
            local_108[1] = 1;
            local_108[0] = (long)local_f8 << 1;
            puVar6 = std::max<unsigned_long>(local_108 + 1,local_108);
            local_f8 = (element_type *)*puVar6;
          }
        }
      }
      else {
        local_380 = (this_01->loc).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      }
      peVar2 = local_378;
      if (local_378 <
          (element_type *)
          (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i) {
        while (local_388 = peVar2,
              local_388 <
              (element_type *)
              (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i) {
          peVar2 = (element_type *)&local_388->field_0x1;
        }
        (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i =
             (__int_type)local_378;
      }
      if (local_380 ==
          (this_01->loc).fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr) {
        for (local_390 = (element_type *)
                         (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>.
                         _M_i; local_390 < local_378;
            local_390 = (element_type *)&local_390->field_0x1) {
          local_368 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      (this_01->loc).fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + (long)local_390;
          local_308 = &(local_368->l).vy;
          local_310 = &(local_368->l).vz;
          local_2b8 = &local_368->p;
          local_318 = local_368;
          local_300 = local_368;
        }
        (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i =
             (__int_type)local_378;
      }
      else {
        local_398 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (this_01->loc).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        local_358 = local_380;
        pAVar7 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                 alignedMalloc((size_t)in_stack_fffffffffffff568,(size_t)in_stack_fffffffffffff560);
        (this_01->loc).fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar7;
        for (local_3a0 = 0;
            local_3a0 < (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i
            ; local_3a0 = local_3a0 + 1) {
          local_340 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      (this_01->loc).fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + local_3a0;
          local_348 = local_398 + local_3a0;
          local_2d8 = &(local_340->l).vy;
          local_2e0 = &(local_340->l).vz;
          local_2c8 = &local_340->p;
          uVar1 = *(undefined8 *)((long)&(local_348->l).vx.field_0 + 8);
          *(undefined8 *)&(local_340->l).vx.field_0 = *(undefined8 *)&(local_348->l).vx.field_0;
          *(undefined8 *)((long)&(local_340->l).vx.field_0 + 8) = uVar1;
          local_290 = &(local_348->l).vy;
          local_288 = &(local_340->l).vy;
          uVar1 = *(undefined8 *)((long)&(local_348->l).vy.field_0 + 8);
          *(undefined8 *)&local_288->field_0 = *(undefined8 *)&local_290->field_0;
          *(undefined8 *)((long)&(local_340->l).vy.field_0 + 8) = uVar1;
          local_2a0 = &(local_348->l).vz;
          local_298 = &(local_340->l).vz;
          uVar1 = *(undefined8 *)((long)&(local_348->l).vz.field_0 + 8);
          *(undefined8 *)&local_298->field_0 = *(undefined8 *)&local_2a0->field_0;
          *(undefined8 *)((long)&(local_340->l).vz.field_0 + 8) = uVar1;
          local_338 = &local_348->p;
          local_330 = &local_340->p;
          uVar1 = *(undefined8 *)((long)&(local_348->p).field_0 + 8);
          *(undefined8 *)&local_330->field_0 = *(undefined8 *)&local_338->field_0;
          *(undefined8 *)((long)&(local_340->p).field_0 + 8) = uVar1;
          local_328 = local_340;
          local_2d0 = local_340;
          local_2b0 = local_348;
          local_2a8 = local_340;
          local_280 = local_348;
          local_278 = local_340;
        }
        for (local_3a8 = (element_type *)
                         (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>.
                         _M_i; local_3a8 < local_378;
            local_3a8 = (element_type *)&local_3a8->field_0x1) {
          local_360 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                      (this_01->loc).fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + (long)local_3a8;
          local_2f0 = &(local_360->l).vy;
          local_2f8 = &(local_360->l).vz;
          local_2c0 = &local_360->p;
          local_320 = local_360;
          local_2e8 = local_360;
        }
        local_270 = (this_01->loc).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_268 = local_398;
        alignedFree(in_stack_fffffffffffff558);
        (this_01->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i =
             (__int_type)local_378;
        (this_01->loc).fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_380;
      }
      for (local_8d8 = 0; uVar3 = local_8d8,
          sVar8 = std::
                  vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                  ::size(&local_8c8), uVar3 < sVar8; local_8d8 = local_8d8 + 1) {
        local_668 = std::
                    vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                    ::operator[](&local_8c8,local_8d8);
        local_660 = &local_958;
        local_8 = (local_668->l).vx.field_0.field_0.z;
        local_10 = (local_668->l).vx.field_0.field_0.x;
        local_c = (local_668->l).vx.field_0.field_0.y;
        local_28 = *(undefined8 *)&(local_668->l).vx.field_0;
        local_4 = 0;
        uStack_20 = (ulong)(uint)local_8;
        local_80 = &local_948;
        local_88 = &(local_668->l).vy;
        local_30 = (local_668->l).vy.field_0.field_0.z;
        local_38 = (local_88->field_0).field_0.x;
        local_34 = (local_668->l).vy.field_0.field_0.y;
        local_48 = *(undefined8 *)&local_88->field_0;
        local_2c = 0;
        uStack_40 = (ulong)(uint)local_30;
        local_70 = &local_938;
        local_78 = &(local_668->l).vz;
        local_50 = (local_668->l).vz.field_0.field_0.z;
        local_58 = (local_78->field_0).field_0.x;
        local_54 = (local_668->l).vz.field_0.field_0.y;
        local_68 = *(undefined8 *)&local_78->field_0;
        local_4c = 0;
        uStack_60 = (ulong)(uint)local_50;
        local_650 = &local_928;
        local_658 = &local_668->p;
        local_620 = (local_668->p).field_0.field_0.z;
        local_628 = (local_658->field_0).field_0.x;
        local_624 = (local_668->p).field_0.field_0.y;
        local_638 = *(undefined8 *)&local_658->field_0;
        local_61c = 0;
        uStack_630 = (ulong)(uint)local_620;
        local_710 = &local_918;
        local_718 = &local_958;
        local_4a0 = &local_908;
        local_4a8 = &local_948;
        local_908 = local_948;
        uStack_900 = uStack_940;
        local_4b0 = &local_8f8;
        local_4b8 = &local_938;
        local_8f8 = local_938;
        uStack_8f0 = uStack_930;
        local_4c0 = &local_8e8;
        local_4c8 = &local_928;
        local_8e8 = local_928;
        uStack_8e0 = uStack_920;
        local_648 = local_8d8;
        local_770 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (pXVar10->loc).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + local_8d8;
        local_778 = &local_918;
        *(undefined8 *)&(local_770->l).vx.field_0 = local_28;
        *(ulong *)((long)&(local_770->l).vx.field_0 + 8) = uStack_20;
        local_4e8 = &local_908;
        local_4e0 = &(local_770->l).vy;
        *(undefined8 *)&local_4e0->field_0 = local_948;
        *(ulong *)((long)&(local_770->l).vy.field_0 + 8) = uStack_940;
        local_4f8 = &local_8f8;
        local_4f0 = &(local_770->l).vz;
        *(undefined8 *)&local_4f0->field_0 = local_938;
        *(ulong *)((long)&(local_770->l).vz.field_0 + 8) = uStack_930;
        local_760 = &local_8e8;
        local_758 = &local_770->p;
        *(undefined8 *)&local_758->field_0 = local_928;
        *(ulong *)((long)&(local_770->p).field_0 + 8) = uStack_920;
        local_708 = local_718;
        local_700 = local_710;
        local_508 = local_778;
        local_500 = local_770;
        local_4d8 = local_778;
        local_4d0 = local_770;
        local_498 = local_718;
        local_490 = local_710;
        local_a8 = local_668;
        local_a0 = local_660;
        local_98 = local_668;
        local_90 = local_660;
        local_958 = local_28;
        uStack_950 = uStack_20;
        local_948 = local_48;
        uStack_940 = uStack_40;
        local_938 = local_68;
        uStack_930 = uStack_60;
        local_928 = local_638;
        uStack_920 = uStack_630;
        local_918 = local_28;
        uStack_910 = uStack_20;
      }
      local_8c9 = 1;
      std::
      vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
      ::~vector(in_stack_fffffffffffff570);
    }
  }
  return (avector<AffineSpace3ff> *)in_RDI;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadAffineSpace3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "AffineSpaceArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        AffineSpace3ff space = AffineSpace3ff(load<AffineSpace3fa>(child));
        spaceArray.push_back(space);
      }
      return spaceArray;
    }
    else if (xml->parm("ofs") != "") {
      std::vector<AffineSpace3f> temp = loadBinary<std::vector<AffineSpace3f>>(xml);
      avector<AffineSpace3ff> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = AffineSpace3ff(AffineSpace3fa(temp[i]));
      return data;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid AffineSpace3fa array");
  }